

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O3

void capnp::compiler::anon_unknown_0::attachDocComment(Builder statement,Array<kj::String> *comment)

{
  long lVar1;
  size_t sVar2;
  String *pSVar3;
  void *pvVar4;
  size_t sVar5;
  ByteCount size;
  void *__src;
  long lVar7;
  char *pcVar8;
  char *__dest;
  Array<kj::String> *__range2;
  Builder builder;
  char *local_88;
  Fault local_80;
  DebugComparison<char_*&,_char_*> local_78;
  Builder local_48;
  long lVar6;
  
  if (comment->size_ == 0) {
    size = 0;
  }
  else {
    lVar7 = 0;
    lVar6 = 0;
    do {
      lVar1 = *(long *)((long)&(comment->ptr->content).size_ + lVar7);
      lVar6 = lVar6 + lVar1 + (ulong)(lVar1 == 0);
      size = (ByteCount)lVar6;
      lVar7 = lVar7 + 0x18;
    } while (comment->size_ * 0x18 != lVar7);
  }
  local_78.op.content.ptr = (char *)(statement._builder.pointers + 2);
  local_78.left = (char **)statement._builder.segment;
  local_78.right = (char *)statement._builder.capTable;
  capnp::_::PointerBuilder::initBlob<capnp::Text>(&local_48,(PointerBuilder *)&local_78,size);
  sVar2 = comment->size_;
  __dest = local_48.content.ptr;
  if (sVar2 != 0) {
    pSVar3 = comment->ptr;
    lVar6 = 0;
    do {
      pvVar4 = *(void **)((long)&(pSVar3->content).size_ + lVar6);
      __src = pvVar4;
      if (pvVar4 != (void *)0x0) {
        __src = *(void **)((long)&(pSVar3->content).ptr + lVar6);
      }
      sVar5 = (long)pvVar4 - 1;
      if (pvVar4 == (void *)0x0) {
        sVar5 = 0;
      }
      local_88 = __dest;
      memcpy(__dest,__src,sVar5);
      lVar7 = *(long *)((long)&(pSVar3->content).size_ + lVar6);
      sVar5 = lVar7 - 1;
      if (lVar7 == 0) {
        sVar5 = 0;
      }
      pcVar8 = __dest + sVar5;
      __dest = pcVar8 + 1;
      *pcVar8 = '\n';
      lVar6 = lVar6 + 0x18;
    } while (sVar2 * 0x18 != lVar6);
  }
  local_78.right = local_48.content.ptr + (local_48.content.size_ - 1);
  local_78.left = &local_88;
  local_78.op.content.ptr = " == ";
  local_78.op.content.size_ = 5;
  local_78.result = __dest == local_78.right;
  if (!local_78.result) {
    local_88 = __dest;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/lexer.c++"
               ,0x6d,FAILED,"pos == builder.end()","_kjCondition,",&local_78);
    kj::_::Debug::Fault::fatal(&local_80);
  }
  return;
}

Assistant:

void attachDocComment(Statement::Builder statement, kj::Array<kj::String>&& comment) {
  size_t size = 0;
  for (auto& line: comment) {
    size += line.size() + 1;  // include newline
  }
  Text::Builder builder = statement.initDocComment(size);
  char* pos = builder.begin();
  for (auto& line: comment) {
    memcpy(pos, line.begin(), line.size());
    pos += line.size();
    *pos++ = '\n';
  }
  KJ_ASSERT(pos == builder.end());
}